

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildJsonConstant(char *rawEmbed)

{
  CNscPStackEntry *this;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  CNscPStackEntry::SetType(this,NscType_Engine_7);
  CNscPStackEntry::PushConstantJson(this,rawEmbed,-1);
  return this;
}

Assistant:

YYSTYPE NscBuildJsonConstant (const char* rawEmbed)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	pOut ->SetType (NscType_Engine_7);
	pOut ->PushConstantJson(rawEmbed);
	return pOut;
}